

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManGraphSortPairs(Nwk_Grf_t *p)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  int local_24;
  int i;
  int *pIdToPair;
  int nSize;
  Nwk_Grf_t *p_local;
  
  iVar1 = Vec_IntSize(p->vPairs);
  __ptr = malloc((long)(p->nObjs + 1) << 2);
  for (local_24 = 0; local_24 <= p->nObjs; local_24 = local_24 + 1) {
    *(undefined4 *)((long)__ptr + (long)local_24 * 4) = 0xffffffff;
  }
  local_24 = 0;
  while( true ) {
    if (p->vPairs->nSize <= local_24) {
      Vec_IntClear(p->vPairs);
      local_24 = 0;
      do {
        if (p->nObjs < local_24) {
          iVar2 = Vec_IntSize(p->vPairs);
          if (iVar1 != iVar2) {
            __assert_fail("nSize == Vec_IntSize(p->vPairs)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                          ,0x182,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          return;
        }
        if (-1 < *(int *)((long)__ptr + (long)local_24 * 4)) {
          if (*(int *)((long)__ptr + (long)local_24 * 4) <= local_24) {
            __assert_fail("i < pIdToPair[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                          ,0x17e,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
          }
          Vec_IntPush(p->vPairs,local_24);
          Vec_IntPush(p->vPairs,*(int *)((long)__ptr + (long)local_24 * 4));
        }
        local_24 = local_24 + 1;
      } while( true );
    }
    if (*(int *)((long)__ptr + (long)p->vPairs->pArray[local_24] * 4) != -1) break;
    *(int *)((long)__ptr + (long)p->vPairs->pArray[local_24] * 4) = p->vPairs->pArray[local_24 + 1];
    local_24 = local_24 + 2;
  }
  __assert_fail("pIdToPair[ p->vPairs->pArray[i] ] == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                ,0x176,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
}

Assistant:

void Nwk_ManGraphSortPairs( Nwk_Grf_t * p )
{
    int nSize = Vec_IntSize(p->vPairs);
    int * pIdToPair, i;
    // allocate storage
    pIdToPair = ABC_ALLOC( int, p->nObjs+1 );
    for ( i = 0; i <= p->nObjs; i++ )
        pIdToPair[i] = -1;
    // create mapping
    for ( i = 0; i < p->vPairs->nSize; i += 2 )
    {
        assert( pIdToPair[ p->vPairs->pArray[i] ] == -1 );
        pIdToPair[ p->vPairs->pArray[i] ] = p->vPairs->pArray[i+1];
    }
    // recreate pairs
    Vec_IntClear( p->vPairs );
    for ( i = 0; i <= p->nObjs; i++ )
        if ( pIdToPair[i] >= 0 )
        {
            assert( i < pIdToPair[i] );
            Vec_IntPush( p->vPairs, i );
            Vec_IntPush( p->vPairs, pIdToPair[i] );
        }
    assert( nSize == Vec_IntSize(p->vPairs) );
    ABC_FREE( pIdToPair );
}